

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RenX_Server.cpp
# Opt level: O0

GameCommand * __thiscall
RenX::Server::triggerCommand
          (Server *this,string_view trigger,PlayerInfo *player,string_view parameters)

{
  int iVar1;
  Plugin *pPVar2;
  bool bVar3;
  int iVar4;
  reference this_00;
  pointer pGVar5;
  ulong uVar6;
  Core *this_01;
  vector<RenX::Plugin_*,_std::allocator<RenX::Plugin_*>_> *this_02;
  reference ppPVar7;
  type pGVar8;
  basic_string_view<char,_std::char_traits<char>_> message;
  Plugin **plugin;
  iterator __end3;
  iterator __begin3;
  vector<RenX::Plugin_*,_std::allocator<RenX::Plugin_*>_> *__range3;
  unique_ptr<RenX::GameCommand,_std::default_delete<RenX::GameCommand>_> *command;
  iterator __end1;
  iterator __begin1;
  vector<std::unique_ptr<RenX::GameCommand,_std::default_delete<RenX::GameCommand>_>,_std::allocator<std::unique_ptr<RenX::GameCommand,_std::default_delete<RenX::GameCommand>_>_>_>
  *__range1;
  PlayerInfo *player_local;
  Server *this_local;
  string_view parameters_local;
  string_view trigger_local;
  
  GameCommand::active_server = this;
  __end1 = std::
           vector<std::unique_ptr<RenX::GameCommand,_std::default_delete<RenX::GameCommand>_>,_std::allocator<std::unique_ptr<RenX::GameCommand,_std::default_delete<RenX::GameCommand>_>_>_>
           ::begin(&this->m_commands);
  command = (unique_ptr<RenX::GameCommand,_std::default_delete<RenX::GameCommand>_> *)
            std::
            vector<std::unique_ptr<RenX::GameCommand,_std::default_delete<RenX::GameCommand>_>,_std::allocator<std::unique_ptr<RenX::GameCommand,_std::default_delete<RenX::GameCommand>_>_>_>
            ::end(&this->m_commands);
  while( true ) {
    bVar3 = __gnu_cxx::
            operator==<std::unique_ptr<RenX::GameCommand,_std::default_delete<RenX::GameCommand>_>_*,_std::vector<std::unique_ptr<RenX::GameCommand,_std::default_delete<RenX::GameCommand>_>,_std::allocator<std::unique_ptr<RenX::GameCommand,_std::default_delete<RenX::GameCommand>_>_>_>_>
                      (&__end1,(__normal_iterator<std::unique_ptr<RenX::GameCommand,_std::default_delete<RenX::GameCommand>_>_*,_std::vector<std::unique_ptr<RenX::GameCommand,_std::default_delete<RenX::GameCommand>_>,_std::allocator<std::unique_ptr<RenX::GameCommand,_std::default_delete<RenX::GameCommand>_>_>_>_>
                                *)&command);
    if (((bVar3 ^ 0xffU) & 1) == 0) {
      GameCommand::active_server = GameCommand::selected_server;
      return (GameCommand *)0x0;
    }
    this_00 = __gnu_cxx::
              __normal_iterator<std::unique_ptr<RenX::GameCommand,_std::default_delete<RenX::GameCommand>_>_*,_std::vector<std::unique_ptr<RenX::GameCommand,_std::default_delete<RenX::GameCommand>_>,_std::allocator<std::unique_ptr<RenX::GameCommand,_std::default_delete<RenX::GameCommand>_>_>_>_>
              ::operator*(&__end1);
    pGVar5 = std::unique_ptr<RenX::GameCommand,_std::default_delete<RenX::GameCommand>_>::operator->
                       (this_00);
    uVar6 = Jupiter::Command::matches(pGVar5,trigger._M_len,trigger._M_str);
    if ((uVar6 & 1) != 0) break;
    __gnu_cxx::
    __normal_iterator<std::unique_ptr<RenX::GameCommand,_std::default_delete<RenX::GameCommand>_>_*,_std::vector<std::unique_ptr<RenX::GameCommand,_std::default_delete<RenX::GameCommand>_>,_std::allocator<std::unique_ptr<RenX::GameCommand,_std::default_delete<RenX::GameCommand>_>_>_>_>
    ::operator++(&__end1);
  }
  iVar1 = player->access;
  pGVar5 = std::unique_ptr<RenX::GameCommand,_std::default_delete<RenX::GameCommand>_>::operator->
                     (this_00);
  iVar4 = GameCommand::getAccessLevel(pGVar5);
  if (iVar1 < iVar4) {
    message = sv("Access Denied.",0xe);
    sendMessage(this,player,message);
  }
  else {
    pGVar5 = std::unique_ptr<RenX::GameCommand,_std::default_delete<RenX::GameCommand>_>::operator->
                       (this_00);
    (*(pGVar5->super_Command)._vptr_Command[3])
              (pGVar5,this,player,parameters._M_len,parameters._M_str);
  }
  this_01 = getCore();
  this_02 = Core::getPlugins(this_01);
  __end3 = std::vector<RenX::Plugin_*,_std::allocator<RenX::Plugin_*>_>::begin(this_02);
  plugin = (Plugin **)std::vector<RenX::Plugin_*,_std::allocator<RenX::Plugin_*>_>::end(this_02);
  while (bVar3 = __gnu_cxx::
                 operator==<RenX::Plugin_**,_std::vector<RenX::Plugin_*,_std::allocator<RenX::Plugin_*>_>_>
                           (&__end3,(__normal_iterator<RenX::Plugin_**,_std::vector<RenX::Plugin_*,_std::allocator<RenX::Plugin_*>_>_>
                                     *)&plugin), ((bVar3 ^ 0xffU) & 1) != 0) {
    ppPVar7 = __gnu_cxx::
              __normal_iterator<RenX::Plugin_**,_std::vector<RenX::Plugin_*,_std::allocator<RenX::Plugin_*>_>_>
              ::operator*(&__end3);
    pPVar2 = *ppPVar7;
    pGVar8 = std::unique_ptr<RenX::GameCommand,_std::default_delete<RenX::GameCommand>_>::operator*
                       (this_00);
    (**(code **)(*(long *)pPVar2 + 0x138))
              (pPVar2,this,trigger._M_len,trigger._M_str,player,pGVar8,parameters._M_len,
               parameters._M_str);
    __gnu_cxx::
    __normal_iterator<RenX::Plugin_**,_std::vector<RenX::Plugin_*,_std::allocator<RenX::Plugin_*>_>_>
    ::operator++(&__end3);
  }
  pGVar5 = std::unique_ptr<RenX::GameCommand,_std::default_delete<RenX::GameCommand>_>::get(this_00)
  ;
  return pGVar5;
}

Assistant:

RenX::GameCommand *RenX::Server::triggerCommand(std::string_view trigger, RenX::PlayerInfo &player, std::string_view parameters) {
	RenX::GameCommand::active_server = this;
	for (const auto& command : m_commands) {
		if (command->matches(trigger)) {
			if (player.access >= command->getAccessLevel()) {
				command->trigger(this, &player, parameters);
			}
			else {
				sendMessage(player, "Access Denied."sv);
			}

			// TODO: avoiding modifying behavior for now, but this probably doesn't need to be called on access denied
			for (const auto& plugin : getCore()->getPlugins()) {
				plugin->RenX_OnCommandTriggered(*this, trigger, player, parameters, *command);
			}

			return command.get();
		}
	}

	// TODO: do we need to set active_server on the return above as well?
	RenX::GameCommand::active_server = RenX::GameCommand::selected_server;
	return nullptr;
}